

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void define_gf_group(AV1_COMP *cpi,EncodeFrameParams *frame_params,int is_final_pass)

{
  GF_GROUP *__s;
  int *piVar1;
  PRIMARY_RATE_CONTROL *p_rc;
  FRAME_INFO *frame_info;
  FRAME_UPDATE_TYPE FVar2;
  byte bVar3;
  uint uVar4;
  AV1_PRIMARY *pAVar5;
  FIRSTPASS_STATS *start_pos;
  AV1_PRIMARY *pAVar6;
  FIRSTPASS_STATS *pFVar7;
  int iVar8;
  TWO_PASS_FRAME *twopass_frame;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  undefined4 uVar18;
  uint uVar19;
  uint uVar20;
  TWO_PASS_FRAME *twopass;
  bool bVar21;
  double dVar22;
  double dVar23;
  int i;
  int local_228;
  uint local_224;
  RATE_CONTROL *local_220;
  TWO_PASS_FRAME *local_218;
  int *local_210;
  int *local_208;
  FRAME_INFO *local_200;
  GF_GROUP *local_1f8;
  EncodeFrameParams *local_1f0;
  uint auStack_1e8 [8];
  int layer_frames [7];
  GF_GROUP_STATS gf_stats;
  FIRSTPASS_STATS next_frame;
  
  pAVar5 = cpi->ppi;
  start_pos = (cpi->twopass_frame).stats_in;
  __s = &pAVar5->gf_group;
  iVar9 = (cpi->common).width;
  local_220 = (RATE_CONTROL *)CONCAT44(local_220._4_4_,(cpi->common).height);
  bVar21 = (cpi->rc).frames_since_key == 0;
  pAVar5->internal_altref_allowed = (uint)(1 < (cpi->oxcf).gf_cfg.gf_max_pyr_height);
  local_228 = is_final_pass;
  local_1f0 = frame_params;
  if (!bVar21) {
    memset(__s,0,0x58f4);
    cpi->gf_frame_index = '\0';
  }
  if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) {
    pAVar5 = cpi->ppi;
    if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
      av1_cyclic_refresh_set_golden_update(cpi);
    }
    else {
      iVar9 = (pAVar5->p_rc).cur_gf_index;
      (pAVar5->p_rc).baseline_gf_interval = (pAVar5->p_rc).gf_intervals[iVar9];
      piVar1 = &(cpi->rc).intervals_till_gf_calculate_due;
      *piVar1 = *piVar1 + -1;
      (pAVar5->p_rc).cur_gf_index = iVar9 + 1;
    }
    correct_frames_to_key(cpi);
    iVar9 = (cpi->rc).frames_to_key;
    if (iVar9 < (pAVar5->p_rc).baseline_gf_interval) {
      (pAVar5->p_rc).baseline_gf_interval = iVar9;
    }
    (pAVar5->p_rc).gfu_boost = 2000;
    iVar14 = (pAVar5->p_rc).baseline_gf_interval;
    (pAVar5->p_rc).constrained_gf_group = (uint)(iVar9 <= iVar14);
    (pAVar5->gf_group).max_layer_depth_allowed = (cpi->oxcf).gf_cfg.gf_max_pyr_height;
    iVar9 = (cpi->oxcf).gf_cfg.lag_in_frames;
    if ((((iVar9 < iVar14) || (iVar9 < 3)) || ((cpi->oxcf).gf_cfg.enable_auto_arf == false)) ||
       (iVar14 < (cpi->rc).min_gf_interval)) {
      (pAVar5->gf_group).max_layer_depth_allowed = 0;
    }
    av1_gop_setup_structure(cpi);
    if ((pAVar5->gf_group).size < 1) {
      return;
    }
    lVar12 = 0;
    do {
      FVar2 = (pAVar5->gf_group).update_type[lVar12];
      if ((cpi->oxcf).rc_cfg.mode == AOM_CBR) {
        if (FVar2 == '\0') {
          iVar9 = av1_calc_iframe_target_size_one_pass_cbr(cpi);
        }
        else {
          iVar9 = av1_calc_pframe_target_size_one_pass_cbr(cpi,FVar2);
        }
      }
      else if (FVar2 == '\0') {
        iVar9 = av1_calc_iframe_target_size_one_pass_vbr(cpi);
      }
      else {
        iVar9 = av1_calc_pframe_target_size_one_pass_vbr(cpi,FVar2);
      }
      (pAVar5->gf_group).bit_allocation[lVar12] = iVar9;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pAVar5->gf_group).size);
    return;
  }
  local_1f8 = __s;
  if (cpi->ppi->lap_enabled != 0) {
    correct_frames_to_key(cpi);
  }
  uVar20 = (uint)bVar21;
  accumulate_gop_stats(cpi,uVar20,iVar9,(int)local_220,&next_frame,start_pos,&gf_stats,&i);
  iVar14 = (cpi->oxcf).gf_cfg.gf_min_pyr_height;
  iVar10 = (cpi->rc).min_gf_interval;
  if (((iVar14 < 2) && (0.95 < gf_stats.zero_motion_accumulator)) &&
     ((gf_stats.avg_sr_coded_error < 40.0 && (gf_stats.avg_raw_err_stdev < 2000.0)))) {
    cpi->ppi->internal_altref_allowed = 0;
  }
  if (iVar14 == 0) {
    if (cpi->ppi->lap_enabled == 0) {
      bVar21 = 0x62 < (pAVar5->twopass).kf_zeromotion_pct &&
               0.995 <= gf_stats.zero_motion_accumulator;
    }
    else {
      bVar21 = 0.999 <= gf_stats.zero_motion_accumulator;
    }
    if ((bVar21) || ((pAVar5->p_rc).use_arf_in_this_kf_group == 0)) goto LAB_001f6504;
    iVar14 = (cpi->oxcf).gf_cfg.lag_in_frames;
    bVar21 = SBORROW4(i,4);
    iVar8 = i + -4;
  }
  else {
    if ((pAVar5->p_rc).use_arf_in_this_kf_group == 0) {
LAB_001f6504:
      bVar21 = false;
      goto LAB_001f6506;
    }
    iVar14 = (cpi->oxcf).gf_cfg.lag_in_frames;
    bVar21 = SBORROW4(i,3);
    iVar8 = i + -3;
  }
  bVar21 = bVar21 == iVar8 < 0 && i < iVar14;
LAB_001f6506:
  iVar14 = 0;
  if (bVar21 != false) {
    iVar14 = (cpi->oxcf).gf_cfg.gf_max_pyr_height;
  }
  local_224 = (uint)bVar21;
  (pAVar5->gf_group).max_layer_depth_allowed = iVar14;
  if ((((cpi->oxcf).rc_cfg.mode == AOM_Q) && ((cpi->oxcf).rc_cfg.cq_level < 0x81)) ||
     (cpi->ppi->internal_altref_allowed == 0)) {
    bVar21 = true;
    if ((cpi->oxcf).rc_cfg.best_allowed_q == 0) {
      bVar21 = (cpi->oxcf).rc_cfg.worst_allowed_q != 0;
    }
  }
  else {
    bVar21 = false;
  }
  uVar18 = 0;
  if ((local_224 != 0) && (bVar21)) {
    iVar14 = (cpi->rc).frames_to_key - i;
    uVar18 = 0;
    bVar21 = false;
    if (9 < i) {
      if (iVar14 < 8) {
        bVar21 = iVar10 <= iVar14 + 1;
      }
      else {
        bVar21 = false;
      }
    }
    if ((bool)(iVar10 + 1 < i & ((4 < i && iVar14 == 0) | bVar21))) {
      i = i + -1;
      if (local_228 != 0) {
        (cpi->rc).intervals_till_gf_calculate_due = 0;
      }
      piVar1 = (pAVar5->p_rc).gf_intervals + (pAVar5->p_rc).cur_gf_index;
      *piVar1 = *piVar1 + -1;
      (cpi->twopass_frame).stats_in = start_pos;
      accumulate_gop_stats(cpi,uVar20,iVar9,(int)local_220,&next_frame,start_pos,&gf_stats,&i);
      uVar18 = 0xffffffff;
    }
  }
  iVar9 = i;
  local_220 = (RATE_CONTROL *)CONCAT44(local_220._4_4_,uVar18);
  if (local_228 != 0) {
    piVar1 = &(cpi->rc).intervals_till_gf_calculate_due;
    *piVar1 = *piVar1 + -1;
    piVar1 = &(pAVar5->p_rc).cur_gf_index;
    *piVar1 = *piVar1 + 1;
  }
  local_218 = &cpi->twopass_frame;
  (pAVar5->p_rc).constrained_gf_group = (uint)((cpi->rc).frames_to_key <= i);
  (pAVar5->p_rc).baseline_gf_interval = i;
  (cpi->rc).frames_till_gf_update_due = i;
  av1_gop_setup_structure(cpi);
  pAVar5 = cpi->ppi;
  p_rc = &pAVar5->p_rc;
  twopass = (TWO_PASS_FRAME *)&pAVar5->twopass;
  frame_info = &cpi->frame_info;
  iVar14 = iVar9 - uVar20;
  if (local_224 == 0) {
    local_218->stats_in = start_pos;
    local_208 = &(pAVar5->p_rc).num_stats_used_for_gfu_boost;
    local_210 = &(pAVar5->p_rc).num_stats_required_for_gfu_boost;
    local_200 = frame_info;
    iVar9 = av1_calc_arf_boost((TWO_PASS *)twopass,local_218,p_rc,frame_info,(int)local_220,iVar14,0
                               ,local_208,local_210,pAVar5->lap_enabled);
    twopass_frame = local_218;
    iVar10 = 0x1518;
    if (iVar9 < 0x1519) {
      local_218 = twopass;
      iVar10 = av1_calc_arf_boost((TWO_PASS *)twopass,twopass_frame,p_rc,local_200,(int)local_220,
                                  iVar14,0,local_208,local_210,cpi->ppi->lap_enabled);
      twopass = local_218;
    }
  }
  else {
    iVar9 = (cpi->rc).frames_to_key - iVar9;
    iVar10 = 0;
    if (0 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar14 <= iVar9) {
      iVar10 = iVar14;
    }
    iVar10 = av1_calc_arf_boost((TWO_PASS *)twopass,local_218,p_rc,frame_info,(int)local_220,iVar10,
                                iVar14,&(pAVar5->p_rc).num_stats_used_for_gfu_boost,
                                &(pAVar5->p_rc).num_stats_required_for_gfu_boost,pAVar5->lap_enabled
                               );
  }
  (pAVar5->p_rc).gfu_boost = iVar10;
  (pAVar5->p_rc).arf_boost_factor = 1.0;
  if (((local_224 != 0) &&
      (((cpi->oxcf).rc_cfg.best_allowed_q != 0 || ((cpi->oxcf).rc_cfg.worst_allowed_q != 0)))) &&
     ((uint)((cpi->rc).frames_to_key - iVar14) < 2)) {
    (pAVar5->p_rc).arf_boost_factor = 0.2;
  }
  (cpi->twopass_frame).stats_in = start_pos;
  pAVar6 = cpi->ppi;
  if (pAVar6->lap_enabled != 0) {
    gf_stats.gf_group_err = (double)(pAVar5->p_rc).baseline_gf_interval;
  }
  lVar12 = (long)(cpi->oxcf).rc_cfg.vbrmax_section * (long)(cpi->rc).avg_frame_bandwidth;
  if (lVar12 < -99) {
    lVar12 = 0;
  }
  else {
    lVar12 = lVar12 / 100;
    lVar11 = (long)(cpi->rc).max_frame_bandwidth;
    if (lVar11 <= lVar12) {
      lVar12 = lVar11;
    }
    lVar12 = (long)(int)lVar12;
  }
  lVar11 = (pAVar6->twopass).kf_group_bits;
  if ((lVar11 < 1) || (dVar22 = (pAVar6->twopass).kf_group_error_left, dVar22 <= 0.0)) {
    lVar13 = 0;
  }
  else {
    lVar13 = (long)((gf_stats.gf_group_err / dVar22) * (double)lVar11);
  }
  if (lVar13 < lVar11) {
    lVar11 = lVar13;
  }
  lVar16 = 0;
  if (-1 < lVar13) {
    lVar16 = lVar11;
  }
  lVar12 = lVar12 * (pAVar6->p_rc).baseline_gf_interval;
  if (lVar16 < lVar12) {
    lVar12 = lVar16;
  }
  p_rc->gf_group_bits = lVar12;
  local_220 = (RATE_CONTROL *)gf_stats.gf_group_err;
  if ((cpi->oxcf).rc_cfg.mode != AOM_Q) {
    iVar9 = (pAVar5->p_rc).baseline_gf_interval;
    if (local_228 != 0 && 1 < (long)iVar9) {
      dVar22 = (double)iVar9;
      iVar14 = get_twopass_worst_quality
                         (cpi,gf_stats.gf_group_raw_error / dVar22,
                          (gf_stats.gf_group_inactive_zone_rows +
                          gf_stats.gf_group_inactive_zone_rows) /
                          ((double)(cpi->common).mi_params.mb_rows * dVar22) +
                          gf_stats.gf_group_skip_pct / dVar22,(int)(lVar12 / (long)iVar9));
      iVar9 = (cpi->rc).active_worst_quality >> 1;
      if (iVar9 < iVar14) {
        iVar9 = iVar14;
      }
      (cpi->rc).active_worst_quality = iVar9;
    }
  }
  if (local_228 != 0) {
    (pAVar5->twopass).kf_group_error_left =
         (pAVar5->twopass).kf_group_error_left - (double)local_220;
  }
  local_220 = &cpi->rc;
  (cpi->twopass_frame).stats_in = start_pos;
  iVar9 = (cpi->rc).frames_since_key;
  if (iVar9 != 0) {
    pFVar7 = ((pAVar5->twopass).stats_buf_ctx)->stats_in_end;
    iVar14 = (pAVar5->p_rc).baseline_gf_interval;
    dVar23 = 0.0;
    dVar22 = 0.0;
    if (0 < iVar14 && start_pos < pFVar7) {
      iVar10 = 1;
      do {
        dVar23 = dVar23 + start_pos->intra_error;
        dVar22 = dVar22 + start_pos->coded_error;
        if (pFVar7 <= start_pos + 1) break;
        bVar21 = iVar10 < iVar14;
        iVar10 = iVar10 + 1;
        start_pos = start_pos + 1;
      } while (bVar21);
    }
    *(int *)&twopass->stats_in =
         (int)(dVar23 / (dVar22 + *(double *)(&DAT_004dce00 + (ulong)(dVar22 < 0.0) * 8)));
  }
  lVar12 = (pAVar5->p_rc).gf_group_bits;
  pAVar6 = cpi->ppi;
  uVar19 = (uint)(iVar9 == 0);
  iVar14 = calculate_boost_bits
                     ((pAVar6->p_rc).baseline_gf_interval - uVar19,(pAVar6->p_rc).gfu_boost,lVar12);
  iVar14 = adjust_boost_bits_for_target_level(cpi,local_220,iVar14,lVar12,1);
  uVar20 = (pAVar5->gf_group).size;
  layer_frames[4] = 0;
  layer_frames[5] = 0;
  layer_frames[6] = 0;
  lVar11 = 0;
  if (local_224 != 0) {
    lVar11 = (long)iVar14;
  }
  layer_frames[0] = 0;
  layer_frames[1] = 0;
  layer_frames[2] = 0;
  layer_frames[3] = 0;
  uVar15 = (pAVar6->p_rc).baseline_gf_interval - (uint)((cpi->rc).frames_since_key == 0);
  if ((int)uVar15 < 2) {
    uVar15 = 1;
  }
  uVar4 = (pAVar5->gf_group).max_layer_depth;
  if ((int)uVar19 < (int)uVar20) {
    uVar17 = (ulong)(iVar9 == 0);
    do {
      FVar2 = (pAVar5->gf_group).update_type[uVar17];
      if ((FVar2 == '\x06') || (FVar2 == '\x03')) {
        layer_frames[(pAVar5->gf_group).layer_depth[uVar17]] =
             layer_frames[(pAVar5->gf_group).layer_depth[uVar17]] + 1;
      }
      uVar17 = uVar17 + 1;
    } while (uVar20 != uVar17);
  }
  auStack_1e8[4] = 0;
  auStack_1e8[5] = 0;
  auStack_1e8[6] = 0;
  auStack_1e8[0] = 0;
  auStack_1e8[1] = 0;
  auStack_1e8[2] = 0;
  auStack_1e8[3] = 0;
  if (1 < (int)uVar4) {
    lVar13 = 0;
    do {
      dVar22 = 1.0;
      if ((ulong)(uVar4 - 1) * 4 + -4 != lVar13) {
        dVar22 = *(double *)(allocate_gf_group_bits_layer_fraction + lVar13 * 2 + 8);
      }
      iVar10 = *(int *)((long)layer_frames + lVar13 + 4);
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      *(int *)((long)auStack_1e8 + lVar13 + 4) = (int)(((double)iVar14 * dVar22) / (double)iVar10);
      iVar14 = iVar14 - (int)((double)iVar14 * dVar22);
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar4 * 4 + -4 != lVar13);
  }
  if ((int)uVar19 < (int)uVar20) {
    uVar17 = (ulong)(iVar9 == 0);
    do {
      bVar3 = (pAVar5->gf_group).update_type[uVar17];
      iVar9 = 0;
      if ((1 < bVar3 - 4) &&
         ((iVar9 = (int)((lVar12 - lVar11) / (long)(ulong)uVar15), bVar3 == 6 || (bVar3 == 3)))) {
        bVar21 = (int)(auStack_1e8[(pAVar5->gf_group).layer_depth[uVar17]] ^ 0x7fffffff) < iVar9;
        iVar9 = auStack_1e8[(pAVar5->gf_group).layer_depth[uVar17]] + iVar9;
        if (bVar21) {
          iVar9 = 0x7fffffff;
        }
      }
      (pAVar5->gf_group).bit_allocation[uVar17] = iVar9;
      uVar17 = uVar17 + 1;
    } while (uVar20 != uVar17);
  }
  if ((int)uVar20 < 0xfa) {
    (pAVar5->gf_group).bit_allocation[(int)uVar20] = 0;
  }
  if (local_228 != 0) {
    (cpi->ppi->gf_state).arf_gf_boost_lst = local_224;
    (pAVar5->twopass).rolling_arf_group_target_bits = 1;
    (pAVar5->twopass).rolling_arf_group_actual_bits = 1;
  }
  local_1f0->frame_type = (cpi->rc).frames_since_key != 0;
  local_1f0->show_frame =
       (uint)(local_1f8->update_type[cpi->gf_frame_index] != '\x06' &&
             local_1f8->update_type[cpi->gf_frame_index] != '\x03');
  return;
}

Assistant:

static void define_gf_group(AV1_COMP *cpi, EncodeFrameParams *frame_params,
                            int is_final_pass) {
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS next_frame;
  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const GFConfig *const gf_cfg = &oxcf->gf_cfg;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  const int f_w = cm->width;
  const int f_h = cm->height;
  int i;
  const int is_intra_only = rc->frames_since_key == 0;

  cpi->ppi->internal_altref_allowed = (gf_cfg->gf_max_pyr_height > 1);

  // Reset the GF group data structures unless this is a key
  // frame in which case it will already have been done.
  if (!is_intra_only) {
    av1_zero(cpi->ppi->gf_group);
    cpi->gf_frame_index = 0;
  }

  if (has_no_stats_stage(cpi)) {
    define_gf_group_pass0(cpi);
    return;
  }

#if CONFIG_THREE_PASS
  if (cpi->third_pass_ctx && oxcf->pass == AOM_RC_THIRD_PASS) {
    int ret = define_gf_group_pass3(cpi, frame_params, is_final_pass);
    if (ret == 0) return;

    av1_free_thirdpass_ctx(cpi->third_pass_ctx);
    cpi->third_pass_ctx = NULL;
  }
#endif  // CONFIG_THREE_PASS

  // correct frames_to_key when lookahead queue is emptying
  if (cpi->ppi->lap_enabled) {
    correct_frames_to_key(cpi);
  }

  GF_GROUP_STATS gf_stats;
  accumulate_gop_stats(cpi, is_intra_only, f_w, f_h, &next_frame, start_pos,
                       &gf_stats, &i);

  const int can_disable_arf = !gf_cfg->gf_min_pyr_height;

  // If this is a key frame or the overlay from a previous arf then
  // the error score / cost of this frame has already been accounted for.
  const int active_min_gf_interval = rc->min_gf_interval;

  // Disable internal ARFs for "still" gf groups.
  //   zero_motion_accumulator: minimum percentage of (0,0) motion;
  //   avg_sr_coded_error:      average of the SSE per pixel of each frame;
  //   avg_raw_err_stdev:       average of the standard deviation of (0,0)
  //                            motion error per block of each frame.
  const int can_disable_internal_arfs = gf_cfg->gf_min_pyr_height <= 1;
  if (can_disable_internal_arfs &&
      gf_stats.zero_motion_accumulator > MIN_ZERO_MOTION &&
      gf_stats.avg_sr_coded_error < MAX_SR_CODED_ERROR &&
      gf_stats.avg_raw_err_stdev < MAX_RAW_ERR_VAR) {
    cpi->ppi->internal_altref_allowed = 0;
  }

  int use_alt_ref;
  if (can_disable_arf) {
    use_alt_ref =
        !is_almost_static(gf_stats.zero_motion_accumulator,
                          twopass->kf_zeromotion_pct, cpi->ppi->lap_enabled) &&
        p_rc->use_arf_in_this_kf_group && (i < gf_cfg->lag_in_frames) &&
        (i >= MIN_GF_INTERVAL);
  } else {
    use_alt_ref = p_rc->use_arf_in_this_kf_group &&
                  (i < gf_cfg->lag_in_frames) && (i > 2);
  }
  if (use_alt_ref) {
    gf_group->max_layer_depth_allowed = gf_cfg->gf_max_pyr_height;
  } else {
    gf_group->max_layer_depth_allowed = 0;
  }

  int alt_offset = 0;
  // The length reduction strategy is tweaked for certain cases, and doesn't
  // work well for certain other cases.
  const int allow_gf_length_reduction =
      ((rc_cfg->mode == AOM_Q && rc_cfg->cq_level <= 128) ||
       !cpi->ppi->internal_altref_allowed) &&
      !is_lossless_requested(rc_cfg);

  if (allow_gf_length_reduction && use_alt_ref) {
    // adjust length of this gf group if one of the following condition met
    // 1: only one overlay frame left and this gf is too long
    // 2: next gf group is too short to have arf compared to the current gf

    // maximum length of next gf group
    const int next_gf_len = rc->frames_to_key - i;
    const int single_overlay_left =
        next_gf_len == 0 && i > REDUCE_GF_LENGTH_THRESH;
    // the next gf is probably going to have a ARF but it will be shorter than
    // this gf
    const int unbalanced_gf =
        i > REDUCE_GF_LENGTH_TO_KEY_THRESH &&
        next_gf_len + 1 < REDUCE_GF_LENGTH_TO_KEY_THRESH &&
        next_gf_len + 1 >= rc->min_gf_interval;

    if (single_overlay_left || unbalanced_gf) {
      const int roll_back = REDUCE_GF_LENGTH_BY;
      // Reduce length only if active_min_gf_interval will be respected later.
      if (i - roll_back >= active_min_gf_interval + 1) {
        alt_offset = -roll_back;
        i -= roll_back;
        if (is_final_pass) rc->intervals_till_gf_calculate_due = 0;
        p_rc->gf_intervals[p_rc->cur_gf_index] -= roll_back;
        reset_fpf_position(&cpi->twopass_frame, start_pos);
        accumulate_gop_stats(cpi, is_intra_only, f_w, f_h, &next_frame,
                             start_pos, &gf_stats, &i);
      }
    }
  }

  update_gop_length(rc, p_rc, i, is_final_pass);

  // Set up the structure of this Group-Of-Pictures (same as GF_GROUP)
  av1_gop_setup_structure(cpi);

  set_gop_bits_boost(cpi, i, is_intra_only, is_final_pass, use_alt_ref,
                     alt_offset, start_pos, &gf_stats);

  frame_params->frame_type =
      rc->frames_since_key == 0 ? KEY_FRAME : INTER_FRAME;
  frame_params->show_frame =
      !(gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
        gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE);
}